

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_tree.cc
# Opt level: O3

void memory_tree_ns::route_to_leaf
               (memory_tree *b,single_learner *base,uint32_t *ec_array_index,uint32_t cn,
               v_array<unsigned_int> *path,bool insertion)

{
  uint64_t *puVar1;
  int iVar2;
  uint32_t uVar3;
  example *peVar4;
  bool bVar5;
  node *pnVar6;
  uint32_t *puVar7;
  labels preds;
  labels multilabels;
  uint local_98;
  float local_94;
  label_t local_90;
  uint32_t *local_88;
  label_t *local_80;
  float *local_78;
  float *pfStack_70;
  float *local_68;
  size_t sStack_60;
  label_t local_58;
  label_t lStack_50;
  label_t local_48;
  label_t lStack_40;
  
  peVar4 = (b->examples)._begin[*ec_array_index];
  local_80 = (label_t *)&peVar4->l;
  if (b->oas == 0) {
    local_90 = *local_80;
    local_94 = (peVar4->pred).scalar;
  }
  else {
    local_58 = *local_80;
    lStack_50 = (label_t)(peVar4->l).cs.costs._end;
    local_48 = (label_t)(peVar4->l).cs.costs.end_array;
    lStack_40 = (label_t)(peVar4->l).cs.costs.erase_count;
    local_78 = (peVar4->pred).scalars._begin;
    pfStack_70 = (peVar4->pred).scalars._end;
    local_68 = (peVar4->pred).scalars.end_array;
    sStack_60 = (peVar4->pred).scalars.erase_count;
    local_94 = 0.0;
  }
  local_98 = cn;
  local_88 = ec_array_index;
  v_array<unsigned_int>::clear(path);
  (peVar4->l).cs.costs._begin = (wclass *)0x3f8000007f7fffff;
  (peVar4->l).simple.initial = 0.0;
  iVar2 = (b->nodes)._begin[cn].internal;
  while (iVar2 != -1) {
    v_array<unsigned_int>::push_back(path,&local_98);
    uVar3 = (b->nodes)._begin[local_98].base_router;
    puVar1 = &(peVar4->super_example_predict).ft_offset;
    *puVar1 = *puVar1 + (ulong)(*(int *)(base + 0xe0) * uVar3);
    (**(code **)(base + 0x30))(*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),peVar4);
    puVar1 = &(peVar4->super_example_predict).ft_offset;
    *puVar1 = *puVar1 - (ulong)(uVar3 * *(int *)(base + 0xe0));
    if (insertion) {
      pnVar6 = (b->nodes)._begin;
      bVar5 = 0.0 <= (peVar4->pred).scalar;
      (&pnVar6[local_98].nl)[bVar5] = (&pnVar6[local_98].nl)[bVar5] + 1.0;
      puVar7 = &pnVar6[local_98].left + bVar5;
      pnVar6 = (b->nodes)._begin;
    }
    else {
      pnVar6 = (b->nodes)._begin;
      if (0.0 <= (peVar4->pred).scalar) {
        puVar7 = &pnVar6[local_98].right;
      }
      else {
        puVar7 = &pnVar6[local_98].left;
      }
    }
    local_98 = *puVar7;
    iVar2 = pnVar6[local_98].internal;
  }
  v_array<unsigned_int>::push_back(path,&local_98);
  if (b->oas == 0) {
    (peVar4->l).multi = local_90;
    (peVar4->pred).scalar = local_94;
  }
  else {
    (peVar4->pred).scalars.end_array = local_68;
    (peVar4->pred).scalars.erase_count = sStack_60;
    (peVar4->pred).scalars._begin = local_78;
    (peVar4->pred).scalars._end = pfStack_70;
    local_80[2] = local_48;
    local_80[3] = lStack_40;
    *local_80 = local_58;
    local_80[1] = lStack_50;
  }
  if (insertion) {
    v_array<unsigned_int>::push_back(&(b->nodes)._begin[local_98].examples_index,local_88);
    pnVar6 = (b->nodes)._begin;
    if ((b->max_leaf_examples <=
         (ulong)((long)pnVar6[local_98].examples_index._end -
                 (long)pnVar6[local_98].examples_index._begin >> 2)) &&
       (((long)(b->nodes)._end - (long)pnVar6 >> 3) * -0x71c71c71c71c71c7 + 2U < b->max_nodes)) {
      split_leaf(b,base,local_98);
    }
  }
  return;
}

Assistant:

void route_to_leaf(memory_tree& b, single_learner& base, const uint32_t & ec_array_index, uint32_t cn, v_array<uint32_t>& path, bool insertion){
		example& ec = *b.examples[ec_array_index];
        
        MULTICLASS::label_t mc;
        uint32_t save_multi_pred = 0;
        MULTILABEL::labels multilabels;
        MULTILABEL::labels preds;
        if (b.oas == false){
            mc = ec.l.multi;
            save_multi_pred = ec.pred.multiclass;
        }
        else{
            multilabels = ec.l.multilabels;
            preds = ec.pred.multilabels;
        }

        path.clear();
	    ec.l.simple = {FLT_MAX, 1.0, 0.0};
		while(b.nodes[cn].internal != -1){
			path.push_back(cn);  //path stores node id from the root to the leaf
			base.predict(ec, b.nodes[cn].base_router);
			float prediction = ec.pred.scalar;
			if (insertion == false)
				cn = prediction < 0 ? b.nodes[cn].left : b.nodes[cn].right;
			else
			    cn = insert_descent(b.nodes[cn], prediction);
		}
		path.push_back(cn); //push back the leaf 
        
        if (b.oas == false){
            ec.l.multi = mc; 
            ec.pred.multiclass = save_multi_pred;
        }
        else{
            ec.pred.multilabels = preds;
            ec.l.multilabels = multilabels;
        }

        //cout<<"at route to leaf: "<<path.size()<<endl;
		if (insertion == true){
			b.nodes[cn].examples_index.push_back(ec_array_index);
			if ((b.nodes[cn].examples_index.size() >= b.max_leaf_examples) && (b.nodes.size() + 2 < b.max_nodes))
				split_leaf(b,base,cn);
		}
	}